

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5CacheInstArray(Fts5Cursor *pCsr)

{
  Fts5PoslistReader *pFVar1;
  int iVar2;
  i64 iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fts5PoslistReader *pFVar7;
  u8 *puVar8;
  int *piVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  int n;
  u8 *a;
  int local_78;
  int local_4c;
  u8 *local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  if (pCsr->pExpr == (Fts5Expr *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = pCsr->pExpr->nPhrase;
  }
  iVar2 = *(int *)&((pCsr->base).pVtab[1].pModule)->xDisconnect;
  if (pCsr->aInstIter == (Fts5PoslistReader *)0x0) {
    pFVar7 = (Fts5PoslistReader *)sqlite3Fts5MallocZero(&local_3c,(long)(int)uVar14 << 5);
    pCsr->aInstIter = pFVar7;
  }
  pFVar7 = pCsr->aInstIter;
  if (pFVar7 != (Fts5PoslistReader *)0x0) {
    bVar16 = local_3c == 0;
    local_78 = local_3c;
    if (0 < (int)uVar14 && bVar16) {
      piVar9 = &pFVar7->i;
      uVar15 = 0;
      do {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_4c = -0x55555556;
        local_78 = fts5CsrPoslist(pCsr,(int)uVar15,&local_48,&local_4c);
        if (local_78 == 0) {
          ((Fts5PoslistReader *)(piVar9 + -3))->a = (u8 *)0x0;
          *(undefined8 *)(piVar9 + -1) = 0;
          *(undefined8 *)(piVar9 + 1) = 0;
          *(i64 *)(piVar9 + 3) = 0;
          ((Fts5PoslistReader *)(piVar9 + -3))->a = local_48;
          piVar9[-1] = local_4c;
          iVar4 = sqlite3Fts5PoslistNext64(local_48,local_4c,piVar9,(i64 *)(piVar9 + 3));
          if (iVar4 != 0) {
            *(u8 *)((long)piVar9 + 5) = '\x01';
          }
        }
        uVar15 = uVar15 + 1;
        bVar16 = local_78 == 0;
      } while ((uVar15 < uVar14) && (piVar9 = piVar9 + 8, local_78 == 0));
    }
    iVar4 = 0;
    local_3c = local_78;
    if (bVar16) {
      iVar4 = 0;
      do {
        uVar10 = 0xffffffff;
        if (0 < (int)uVar14) {
          uVar15 = 0;
          puVar8 = &pFVar7->bEof;
          do {
            if ((*puVar8 == '\0') &&
               (((int)uVar10 < 0 || (*(long *)(puVar8 + 7) < pFVar7[uVar10].iPos)))) {
              uVar10 = (uint)uVar15;
            }
            uVar15 = uVar15 + 1;
            puVar8 = puVar8 + 0x20;
          } while (uVar14 != uVar15);
        }
        iVar13 = iVar4;
        if ((int)uVar10 < 0) {
LAB_001ee6cc:
          iVar5 = 6;
          iVar4 = iVar13;
        }
        else {
          iVar13 = iVar4 + 1;
          iVar5 = pCsr->nInstAlloc;
          if (iVar13 < iVar5) {
LAB_001ee65b:
            piVar9 = pCsr->aInst;
            lVar11 = (long)(iVar13 * 3 + -3);
            piVar9[lVar11] = uVar10;
            iVar3 = pFVar7[uVar10].iPos;
            uVar12 = (uint)((ulong)iVar3 >> 0x20) & 0x7fffffff;
            piVar9[lVar11 + 1] = uVar12;
            piVar9[lVar11 + 2] = (uint)iVar3 & 0x7fffffff;
            if (iVar2 <= (int)uVar12) {
              local_78 = 0x10b;
              goto LAB_001ee6cc;
            }
            pFVar1 = pFVar7 + uVar10;
            iVar6 = sqlite3Fts5PoslistNext64(pFVar1->a,pFVar1->n,&pFVar1->i,&pFVar7[uVar10].iPos);
            iVar5 = 0;
            iVar4 = iVar13;
            if (iVar6 != 0) {
              pFVar1->bEof = '\x01';
            }
          }
          else {
            iVar6 = iVar5 * 2;
            if (iVar5 == 0) {
              iVar6 = 0x20;
            }
            piVar9 = pCsr->aInst;
            iVar5 = sqlite3_initialize();
            if (iVar5 == 0) {
              piVar9 = (int *)sqlite3Realloc(piVar9,(long)iVar6 * 0xc);
            }
            else {
              piVar9 = (int *)0x0;
            }
            if (piVar9 != (int *)0x0) {
              pCsr->aInst = piVar9;
              pCsr->nInstAlloc = iVar6;
              goto LAB_001ee65b;
            }
            iVar5 = 6;
            local_78 = 7;
          }
        }
      } while (iVar5 == 0);
      local_3c = local_78;
    }
    pCsr->nInstCount = iVar4;
    *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xf7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5CacheInstArray(Fts5Cursor *pCsr){
  int rc = SQLITE_OK;
  Fts5PoslistReader *aIter;       /* One iterator for each phrase */
  int nIter;                      /* Number of iterators/phrases */
  int nCol = ((Fts5Table*)pCsr->base.pVtab)->pConfig->nCol;

  nIter = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  if( pCsr->aInstIter==0 ){
    sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nIter;
    pCsr->aInstIter = (Fts5PoslistReader*)sqlite3Fts5MallocZero(&rc, nByte);
  }
  aIter = pCsr->aInstIter;

  if( aIter ){
    int nInst = 0;                /* Number instances seen so far */
    int i;

    /* Initialize all iterators */
    for(i=0; i<nIter && rc==SQLITE_OK; i++){
      const u8 *a;
      int n;
      rc = fts5CsrPoslist(pCsr, i, &a, &n);
      if( rc==SQLITE_OK ){
        sqlite3Fts5PoslistReaderInit(a, n, &aIter[i]);
      }
    }

    if( rc==SQLITE_OK ){
      while( 1 ){
        int *aInst;
        int iBest = -1;
        for(i=0; i<nIter; i++){
          if( (aIter[i].bEof==0)
              && (iBest<0 || aIter[i].iPos<aIter[iBest].iPos)
            ){
            iBest = i;
          }
        }
        if( iBest<0 ) break;

        nInst++;
        if( nInst>=pCsr->nInstAlloc ){
          int nNewSize = pCsr->nInstAlloc ? pCsr->nInstAlloc*2 : 32;
          aInst = (int*)sqlite3_realloc64(
              pCsr->aInst, nNewSize*sizeof(int)*3
              );
          if( aInst ){
            pCsr->aInst = aInst;
            pCsr->nInstAlloc = nNewSize;
          }else{
            nInst--;
            rc = SQLITE_NOMEM;
            break;
          }
        }

        aInst = &pCsr->aInst[3 * (nInst-1)];
        aInst[0] = iBest;
        aInst[1] = FTS5_POS2COLUMN(aIter[iBest].iPos);
        aInst[2] = FTS5_POS2OFFSET(aIter[iBest].iPos);
        assert( aInst[1]>=0 );
        if( aInst[1]>=nCol ){
          rc = FTS5_CORRUPT;
          break;
        }
        sqlite3Fts5PoslistReaderNext(&aIter[iBest]);
      }
    }

    pCsr->nInstCount = nInst;
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_INST);
  }
  return rc;
}